

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

VMFunction * PClass::FindFunction(FName *clsname,FName *funcname)

{
  PType *p;
  PClassActor *pPVar1;
  DObject *p_00;
  PFunction *pPVar2;
  FName local_c;
  
  if ((long)clsname->Index == 0) {
    p = (PType *)0x0;
  }
  else {
    p = FTypeTable::FindType
                  (&TypeTable,RegistrationInfo.MyClass,0,(long)clsname->Index,(size_t *)0x0);
  }
  pPVar1 = dyn_cast<PClassActor>((DObject *)p);
  if (pPVar1 != (PClassActor *)0x0) {
    local_c = (FName)funcname->Index;
    p_00 = (DObject *)
           PSymbolTable::FindSymbol
                     (&(pPVar1->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.Symbols,&local_c,true);
    pPVar2 = dyn_cast<PFunction>(p_00);
    if (pPVar2 != (PFunction *)0x0) {
      return ((pPVar2->Variants).Array)->Implementation;
    }
  }
  return (VMFunction *)0x0;
}

Assistant:

VMFunction *PClass::FindFunction(FName clsname, FName funcname)
{
	auto cls = PClass::FindActor(clsname);
	if (!cls) return nullptr;
	auto func = dyn_cast<PFunction>(cls->Symbols.FindSymbol(funcname, true));
	if (!func) return nullptr;
	return func->Variants[0].Implementation;
}